

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O3

void Curl_dyn_init(dynbuf *s,size_t toobig)

{
  s->bufr = (char *)0x0;
  s->leng = 0;
  s->allc = 0;
  s->toobig = toobig;
  return;
}

Assistant:

void Curl_dyn_init(struct dynbuf *s, size_t toobig)
{
  DEBUGASSERT(s);
  DEBUGASSERT(toobig);
  s->bufr = NULL;
  s->leng = 0;
  s->allc = 0;
  s->toobig = toobig;
#ifdef DEBUGBUILD
  s->init = DYNINIT;
#endif
}